

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::Session::runInternal(Session *this)

{
  shared_ptr<Catch::Config> *__r;
  pointer pTVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  _func_int **pp_Var4;
  long lVar5;
  size_t sVar6;
  pointer pFVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar12;
  long lVar13;
  ulong uVar14;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar15;
  undefined4 extraout_var;
  long *plVar16;
  tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_> this_00;
  undefined4 extraout_var_00;
  undefined8 *puVar17;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Base_ptr p_Var18;
  FilterMatch *match_1;
  pointer pTVar19;
  pointer pFVar20;
  int iVar21;
  TestCase *test;
  __uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  local_400;
  double local_3f8;
  string local_3f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_390;
  string local_360;
  Totals totals;
  TestGroup tests;
  
  if (this->m_startupExceptions == false) {
    iVar8 = 0;
    if (((this->m_configData).showHelp == false) &&
       (iVar8 = 0, (this->m_configData).libIdentify == false)) {
      config(this);
      seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IConfig);
      __r = &this->m_config;
      if ((this->m_configData).filenamesAsTags == true) {
        pvVar12 = getAllTestCasesSorted
                            (&((__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->super_IConfig);
        pTVar1 = (pvVar12->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pTVar19 = (pvVar12->
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                       _M_impl.super__Vector_impl_data._M_start; pTVar19 != pTVar1;
            pTVar19 = pTVar19 + 1) {
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&tags,&(pTVar19->super_TestCaseInfo).tags);
          std::__cxx11::string::string
                    ((string *)&tests,(pTVar19->super_TestCaseInfo).lineInfo.file,
                     (allocator *)&local_360);
          lVar13 = std::__cxx11::string::find_last_of((char *)&tests,0x435e25);
          if (lVar13 != -1) {
            std::__cxx11::string::erase((ulong)&tests,0);
            *(undefined1 *)
             &((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_IConfig).super_NonCopyable._vptr_NonCopyable = 0x23;
          }
          uVar14 = std::__cxx11::string::rfind((char)&tests,0x2e);
          if (uVar14 != 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)&tests,uVar14);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tags,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tests);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&totals,&tags);
          setTags(&pTVar19->super_TestCaseInfo,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&totals);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&totals);
          std::__cxx11::string::~string((string *)&tests);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&tags);
        }
      }
      list((Catch *)&tests,__r);
      if (tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        clara::std::__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)&tests,
                   &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Catch::Config,void>
                  ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&local_360,
                   &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
        pSVar15 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar8 = (*(pSVar15->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar15);
        plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x20))
                                    ((long *)CONCAT44(extraout_var,iVar8));
        if (*plVar16 == plVar16[1]) {
          peVar3 = (__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Catch::Config,void>
                    ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&tags,
                     &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
          anon_unknown_1::createReporter
                    ((anon_unknown_1 *)&local_400,&(peVar3->m_data).reporterName,(IConfigPtr *)&tags
                    );
        }
        else {
          this_00.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                )operator_new(0x30);
          *(undefined ***)
           this_00.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               &PTR__ListeningReporter_005728b8;
          (((Reporters *)
           ((long)this_00.
                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 8))->
          super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(pointer *)
           ((long)this_00.
                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x10) =
               (pointer)0x0;
          *(pointer *)
           ((long)this_00.
                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x18) =
               (pointer)0x0;
          (((IStreamingReporterPtr *)
           ((long)this_00.
                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x20))->
          _M_t).
          super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (IStreamingReporter *)0x0;
          ((ReporterPreferences *)
          ((long)this_00.
                 super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                 .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x28))->
          shouldRedirectStdOut = false;
          ((ReporterPreferences *)
          ((long)this_00.
                 super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                 .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x28))->
          shouldReportAllAssertions = true;
          local_400._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               (tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               this_00.
               super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
               .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
          pSVar15 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                    ::getInternal();
          iVar8 = (*(pSVar15->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar15);
          puVar17 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar8));
          puVar2 = (undefined8 *)puVar17[1];
          for (puVar17 = (undefined8 *)*puVar17; puVar17 != puVar2; puVar17 = puVar17 + 2) {
            plVar16 = (long *)*puVar17;
            std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<Catch::Config,void>
                      ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&totals,
                       &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
            ReporterConfig::ReporterConfig((ReporterConfig *)&tags,(IConfigPtr *)&totals);
            (**(code **)(*plVar16 + 0x10))(&local_3f0,plVar16,(ReporterConfig *)&tags);
            std::
            vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
            ::
            emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                      ((vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                        *)((long)this_00.
                                 super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                 .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                 _M_head_impl + 8),
                       (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)&local_3f0);
            if ((long *)local_3f0._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_3f0._M_dataplus._M_p + 8))();
            }
            local_3f0._M_dataplus._M_p = (pointer)0x0;
            clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &tags.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&totals.skippedTests);
          }
          peVar3 = (__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Catch::Config,void>
                    ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&tags,
                     &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
          anon_unknown_1::createReporter
                    ((anon_unknown_1 *)&totals,&(peVar3->m_data).reporterName,(IConfigPtr *)&tags);
          ListeningReporter::addReporter
                    ((ListeningReporter *)
                     this_00.
                     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                     (IStreamingReporterPtr *)&totals);
          if (totals._0_8_ != 0) {
            (**(code **)(*(long *)totals._0_8_ + 8))();
          }
          totals.error = 0;
          totals._4_4_ = 0;
        }
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &tags.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        RunContext::RunContext
                  (&tests.m_context,(IConfigPtr *)&local_360,(IStreamingReporterPtr *)&local_400);
        if (local_400._M_t.
            super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
            .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             )0x0) {
          (**(code **)(*(long *)local_400._M_t.
                                super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                _M_head_impl + 8))();
        }
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_360._M_string_length);
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pvVar12 = getAllTestCasesSorted
                            (&(tests.m_config.
                               super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->super_IConfig);
        iVar8 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        TestSpec::matchesByFilter
                  ((Matches *)&tags,(TestSpec *)CONCAT44(extraout_var_01,iVar8),pvVar12,
                   &(tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_IConfig);
        clara::std::
        vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
        _M_move_assign(&tests.m_matches,
                       (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                        *)&tags);
        clara::std::
        vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::~vector
                  ((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                    *)&tags);
        iVar8 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        pFVar7 = tests.m_matches.
                 super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pFVar20 = tests.m_matches.
                  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((tests.m_matches.
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             tests.m_matches.
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (*(long *)(CONCAT44(extraout_var_02,iVar8) + 0x18) ==
            *(long *)(CONCAT44(extraout_var_02,iVar8) + 0x20))) {
          pTVar1 = (pvVar12->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pTVar19 = (pvVar12->
                         super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                         _M_impl.super__Vector_impl_data._M_start; pTVar19 != pTVar1;
              pTVar19 = pTVar19 + 1) {
            if (((pTVar19->super_TestCaseInfo).properties & IsHidden) == None) {
              tags.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar19;
              std::
              _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
              ::_M_emplace_unique<Catch::TestCase_const*>
                        ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                          *)&tests.m_tests,(TestCase **)&tags);
            }
          }
        }
        else {
          for (; pFVar20 != pFVar7; pFVar20 = pFVar20 + 1) {
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::
            _M_insert_range_unique<__gnu_cxx::__normal_iterator<Catch::TestCase_const*const*,std::vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>>>>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)&tests.m_tests,
                       (__normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
                        )(pFVar20->tests).
                         super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
                        )(pFVar20->tests).
                         super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        iVar9 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        totals.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &totals.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header;
        totals._0_8_ = totals._0_8_ & 0xffffffff00000000;
        totals.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        totals.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        totals.skippedTests = 0;
        totals.assertions.passed = 0;
        totals.assertions.failed = 0;
        totals.assertions.failedButOk = 0;
        totals.testCases.passed = 0;
        totals.testCases.failed = 0;
        totals.testCases.failedButOk = 0;
        totals.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        totals.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             totals.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(&tags);
        RunContext::testGroupStarting(&tests.m_context,(string *)&tags,1,1);
        std::__cxx11::string::~string((string *)&tags);
        iVar8 = (int)tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_node_count;
        iVar10 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x13])();
        pp_Var4 = ((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable;
        local_3f8 = (double)iVar8;
        if (iVar10 < 0) {
          iVar10 = (*pp_Var4[0x14])();
          if (iVar10 < 0) {
            iVar10 = 0;
          }
          else {
            iVar10 = (*((tests.m_config.
                         super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])();
            iVar10 = (int)(((double)iVar10 / 100.0) * local_3f8);
          }
        }
        else {
          iVar10 = (*pp_Var4[0x13])();
        }
        iVar11 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x15])();
        pp_Var4 = ((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable;
        if (iVar11 < 0) {
          iVar21 = (*pp_Var4[0x16])();
          iVar11 = iVar8;
          if (-1 < iVar21) {
            iVar11 = (*((tests.m_config.
                         super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_IConfig).super_NonCopyable._vptr_NonCopyable[0x16])();
            iVar11 = (int)(((double)iVar11 / 100.0) * local_3f8);
          }
        }
        else {
          iVar11 = (*pp_Var4[0x15])();
        }
        iVar21 = 0;
        local_3f8 = (double)CONCAT44(extraout_var_03,iVar9);
        for (p_Var18 = tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pFVar7 = tests.m_matches.
                     super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            sVar6 = tests.m_context.m_totals.assertions.failed,
            pFVar20 = tests.m_matches.
                      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            (_Rb_tree_header *)p_Var18 != &tests.m_tests._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18)) {
          iVar9 = (*((tests.m_context.m_config.
                      super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_NonCopyable)._vptr_NonCopyable[9])();
          if (sVar6 < (ulong)(long)iVar9) {
            if ((iVar21 < iVar10) || (iVar11 <= iVar21)) {
              iVar21 = iVar21 + 1;
            }
            else {
              std::__cxx11::string::string((string *)&local_360,*(string **)(p_Var18 + 1));
              anon_unknown_1::renderTestProgress(iVar21,iVar8,&local_360);
              std::__cxx11::string::~string((string *)&local_360);
              RunContext::runTest((Totals *)&tags,&tests.m_context,*(TestCase **)(p_Var18 + 1));
              Totals::operator+=(&totals,(Totals *)&tags);
              clara::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::~_Rb_tree(&local_390);
              iVar21 = iVar21 + 1;
              if (iVar21 == iVar8) {
                std::__cxx11::string::string((string *)&local_3f0,*(string **)(p_Var18 + 1));
                anon_unknown_1::renderTestProgress(iVar8,iVar8,&local_3f0);
                std::__cxx11::string::~string((string *)&local_3f0);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                iVar21 = iVar8;
              }
            }
          }
          else {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x78))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       *(undefined8 *)(p_Var18 + 1));
          }
        }
        for (; pFVar20 != pFVar7; pFVar20 = pFVar20 + 1) {
          if ((pFVar20->tests).
              super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              (pFVar20->tests).
              super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x18))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       pFVar20);
            totals.error = -1;
          }
        }
        lVar13 = *(long *)((long)local_3f8 + 0x18);
        lVar5 = *(long *)((long)local_3f8 + 0x20);
        if (lVar13 != lVar5) {
          for (; lVar13 != lVar5; lVar13 = lVar13 + 0x20) {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x20))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       lVar13);
          }
        }
        (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(&tags);
        RunContext::testGroupEnded(&tests.m_context,(string *)&tags,&totals,1,1);
        std::__cxx11::string::~string((string *)&tags);
        iVar8 = (*(((__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
        if (((byte)iVar8 & totals.error == -1) == 0) {
          iVar8 = (int)totals.assertions.failed;
          if ((int)totals.assertions.failed < totals.error) {
            iVar8 = totals.error;
          }
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
        }
        else {
          iVar8 = 2;
        }
        clara::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::~_Rb_tree(&totals.skippedTestReasons._M_t);
        anon_unknown_1::TestGroup::~TestGroup(&tests);
      }
      else {
        iVar8 = *(int *)&((tests.m_config.
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         super_IConfig).super_NonCopyable._vptr_NonCopyable;
      }
    }
  }
  else {
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }